

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::addError(Reader *this,string *message,Token *token,Location extra)

{
  undefined1 auStack_68 [8];
  ErrorInfo info;
  Location extra_local;
  Token *token_local;
  string *message_local;
  Reader *this_local;
  
  info.extra_ = extra;
  ErrorInfo::ErrorInfo((ErrorInfo *)auStack_68);
  info.token_.start_ = token->end_;
  auStack_68._0_4_ = token->type_;
  auStack_68._4_4_ = *(undefined4 *)&token->field_0x4;
  info.token_._0_8_ = token->start_;
  std::__cxx11::string::operator=((string *)&info.token_.end_,(string *)message);
  info.message_.field_2._8_8_ = info.extra_;
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::push_back
            (&this->errors_,(value_type *)auStack_68);
  ErrorInfo::~ErrorInfo((ErrorInfo *)auStack_68);
  return false;
}

Assistant:

bool 
Reader::addError( const std::string &message, 
                  Token &token,
                  Location extra )
{
   ErrorInfo info;
   info.token_ = token;
   info.message_ = message;
   info.extra_ = extra;
   errors_.push_back( info );
   return false;
}